

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAuto.c
# Opt level: O0

Vec_Ptr_t * Cmf_CreateOptions(Vec_Wec_t *vPars)

{
  int iVar1;
  uint uVar2;
  Vec_Ptr_t *vOpts_00;
  Vec_Int_t *p;
  float fVar3;
  float NumF;
  Vec_Int_t *vLine;
  Vec_Ptr_t *vOpts;
  int Argc;
  int i;
  int Num;
  int Symb;
  char Argv [100] [20];
  Vec_Wec_t *vPars_local;
  
  vOpts_00 = Vec_PtrAlloc(100);
  p = Vec_WecEntry(vPars,0);
  printf("Creating all possible settings to be used by the autotuner:\n");
  vOpts._0_4_ = 1;
  sprintf((char *)&Num,"autotuner");
  for (vOpts._4_4_ = 0; iVar1 = Vec_IntSize(p), vOpts._4_4_ + 1 < iVar1;
      vOpts._4_4_ = vOpts._4_4_ + 2) {
    uVar2 = Vec_IntEntry(p,vOpts._4_4_);
    iVar1 = Vec_IntEntry(p,vOpts._4_4_ + 1);
    fVar3 = Abc_Int2Float(iVar1);
    iVar1 = (int)vOpts + 1;
    sprintf((char *)(&Num + (long)(int)vOpts * 5),"-%c",(ulong)uVar2);
    if (0.0 <= fVar3) {
      if ((fVar3 != (float)(int)fVar3) || (NAN(fVar3) || NAN((float)(int)fVar3))) {
        sprintf((char *)(&Num + (long)iVar1 * 5),"%.3f",(double)fVar3);
      }
      else {
        sprintf((char *)(&Num + (long)iVar1 * 5),"%d",(ulong)(uint)(int)fVar3);
      }
      vOpts._0_4_ = (int)vOpts + 2;
      iVar1 = (int)vOpts;
    }
    vOpts._0_4_ = iVar1;
  }
  Cmf_CreateOptions_rec(vPars,1,(char (*) [20])&Num,(int)vOpts,vOpts_00);
  iVar1 = Vec_PtrSize(vOpts_00);
  printf("Finished creating %d settings.\n\n",(long)iVar1 / 2 & 0xffffffff,
         (long)iVar1 % 2 & 0xffffffff);
  return vOpts_00;
}

Assistant:

Vec_Ptr_t * Cmf_CreateOptions( Vec_Wec_t * vPars )
{
    char Argv[CMD_AUTO_ARG_MAX][20];
    int Symb, Num, i, Argc = 0;
    Vec_Ptr_t * vOpts = Vec_PtrAlloc( 100 );
    Vec_Int_t * vLine = Vec_WecEntry( vPars, 0 );
    printf( "Creating all possible settings to be used by the autotuner:\n" );
    sprintf( Argv[Argc++], "autotuner" );
    Vec_IntForEachEntryDouble( vLine, Symb, Num, i )
    {
        float NumF = Abc_Int2Float(Num);
        sprintf( Argv[Argc++], "-%c", Symb );
        if ( NumF < 0.0 )
            continue;
        if ( NumF == (float)(int)NumF )
            sprintf( Argv[Argc++], "%d", (int)NumF );
        else
            sprintf( Argv[Argc++], "%.3f", NumF );
    }
    Cmf_CreateOptions_rec( vPars, 1, Argv, Argc, vOpts );
    printf( "Finished creating %d settings.\n\n", Vec_PtrSize(vOpts)/2 );
    return vOpts;
}